

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_exif.cc
# Opt level: O0

anon_unknown_0 * __thiscall
core::image::anon_unknown_0::debug_print(anon_unknown_0 *this,string *value)

{
  ulong uVar1;
  allocator local_19;
  string *local_18;
  string *value_local;
  
  local_18 = (string *)value;
  value_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)this,local_18);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"<not set>",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return this;
}

Assistant:

std::string
    debug_print (std::string const& value)
    {
        if (value.empty())
            return "<not set>";
        else
            return value;
    }